

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart_ping_pong.c
# Opt level: O1

void client_handle_read(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
                       cio_read_buffer *read_buffer,size_t num_bytes)

{
  cio_write_buffer *buffer;
  uint8_t recv_buffer [128];
  undefined1 auStack_a8 [128];
  
  if (err == CIO_SUCCESS) {
    memcpy(auStack_a8,read_buffer->fetch_ptr,num_bytes);
    auStack_a8[num_bytes] = 0;
    fprintf(_stdout,"Client received data: %s , now sending...\n",auStack_a8);
    *(size_t *)handler_context = num_bytes;
    buffer = (cio_write_buffer *)((long)handler_context + 0xa8);
    *(cio_write_buffer **)((long)handler_context + 0xb0) = buffer;
    *(cio_write_buffer **)((long)handler_context + 0xa8) = buffer;
    *(undefined8 *)((long)handler_context + 0xb8) = 0;
    *(undefined8 *)((long)handler_context + 0xc0) = 0;
    *(uint8_t **)((long)handler_context + 0xd8) = read_buffer->fetch_ptr;
    *(size_t *)((long)handler_context + 0xe0) = num_bytes;
    *(cio_write_buffer **)((long)handler_context + 200) = buffer;
    *(cio_write_buffer **)((long)handler_context + 0xd0) = buffer;
    *(long *)((long)handler_context + 0xa8) = (long)handler_context + 200;
    *(long *)((long)handler_context + 0xb0) = (long)handler_context + 200;
    *(long *)((long)handler_context + 0xb8) = *(long *)((long)handler_context + 0xb8) + 1;
    *(long *)((long)handler_context + 0xc0) = *(long *)((long)handler_context + 0xc0) + num_bytes;
    cio_buffered_stream_write(buffered_stream,buffer,client_handle_write,handler_context);
  }
  else {
    if (err == CIO_EOF) {
      fwrite("connection closed by peer\n",0x1a,1,_stdout);
      cio_buffered_stream_close(buffered_stream);
      return;
    }
    client_handle_read_cold_1();
  }
  return;
}

Assistant:

static void client_handle_read(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *read_buffer, size_t num_bytes)
{
	struct client *client = handler_context;

	if (cio_unlikely(err == CIO_EOF)) {
		(void)fprintf(stdout, "connection closed by peer\n");
		cio_buffered_stream_close(buffered_stream);
		return;
	}

	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "read error!\n");
		cio_buffered_stream_close(buffered_stream);
		return;
	}

	uint8_t recv_buffer[BUFFER_SIZE];
	memcpy(recv_buffer, cio_read_buffer_get_read_ptr(read_buffer), num_bytes);
	recv_buffer[num_bytes] = '\0';
	(void)fprintf(stdout, "Client received data: %s , now sending...\n", recv_buffer);

	client->bytes_read = num_bytes;
	cio_write_buffer_head_init(&client->wbh);
	cio_write_buffer_element_init(&client->wb, cio_read_buffer_get_read_ptr(read_buffer), num_bytes);
	cio_write_buffer_queue_tail(&client->wbh, &client->wb);
	cio_buffered_stream_write(buffered_stream, &client->wbh, client_handle_write, client);
}